

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBoss.cpp
# Opt level: O2

void __thiscall CBoss::showInfo(CBoss *this)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"id: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(this->super_CWorker)._id);
  poVar1 = std::operator<<(poVar1,"\tname: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_CWorker)._name);
  poVar1 = std::operator<<(poVar1,"\tlevel:");
  (*(this->super_CWorker)._vptr_CWorker[1])(asStack_38,this);
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::operator<<(poVar1,"\tduty:");
  poVar1 = std::operator<<(poVar1,"to manage the whole company");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void CBoss::showInfo()
{
    cout << "id: "     << this->_id
         << "\tname: " << this->_name
         << "\tlevel:" << this->getLevel()
         << "\tduty:"
         << "to manage the whole company"
         << endl;
}